

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::internal::
ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>_>
::ReturnAction(ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>_>
               *this,ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>
                     *value)

{
  __uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *this_00;
  
  this_00 = (__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *)
            operator_new(0x28);
  std::__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::__uniq_ptr_impl
            (this_00,(__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *)value);
  std::
  __shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>,void>
            ((__shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>,(__gnu_cxx::_Lock_policy)2>
              *)this,(ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>
                      *)this_00);
  return;
}

Assistant:

explicit ReturnAction(R value) : value_(new R(std::move(value))) {}